

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall
fmp4_stream::emsg::write_emsg_as_mpd_event(emsg *this,ostream *ostr,uint64_t base_time)

{
  uchar *puVar1;
  int iVar2;
  ostream *poVar3;
  string local_40;
  
  poVar3 = std::operator<<(ostr,"<event ");
  poVar3 = std::operator<<(poVar3,"presentationtime=");
  poVar3 = std::operator<<(poVar3,'\"');
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,'\"');
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"duration=");
  poVar3 = std::operator<<(poVar3,'\"');
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,'\"');
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"id=");
  poVar3 = std::operator<<(poVar3,'\"');
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,'\"');
  iVar2 = std::__cxx11::string::compare((char *)&this->scheme_id_uri_);
  if (iVar2 == 0) {
    poVar3 = std::operator<<(ostr,'>');
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"  <signal xmlns=");
    poVar3 = std::operator<<(poVar3,'\"');
    poVar3 = std::operator<<(poVar3,"http://www.scte.org/schemas/35/2016");
    poVar3 = std::operator<<(poVar3,'\"');
    poVar3 = std::operator<<(poVar3,'>');
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"    <binary>");
    puVar1 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    base64_encode_abi_cxx11_
              (&local_40,puVar1,
               (ulong)(uint)(*(int *)&(this->message_data_).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1));
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    poVar3 = std::operator<<(poVar3,"</binary>");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"  </signal>");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<(ostr," ");
    poVar3 = std::operator<<(poVar3,"contentencoding=");
    poVar3 = std::operator<<(poVar3,'\"');
    poVar3 = std::operator<<(poVar3,"base64");
    poVar3 = std::operator<<(poVar3,'\"');
    poVar3 = std::operator<<(poVar3,'>');
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    puVar1 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    base64_encode_abi_cxx11_
              (&local_40,puVar1,
               (ulong)(uint)(*(int *)&(this->message_data_).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1));
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&local_40);
  poVar3 = std::operator<<(ostr,"</event>");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void emsg::write_emsg_as_mpd_event(std::ostream &ostr, uint64_t base_time) const
	{
		ostr << "<event "
			<< "presentationtime=" << '"' << (this->version_ ? presentation_time_ : base_time + presentation_time_delta_) << '"' << " "  \
			<< "duration=" << '"' << event_duration_ << '"' << " "  \
			<< "id=" << '"' << id_ << '"';
		if (this->scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
		{
			ostr << '>' << std::endl << "  <signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
				<< "    <binary>" << base64_encode(this->message_data_.data(), (unsigned int)this->message_data_.size()) << "</binary>" << std::endl
				<< "  </signal>" << std::endl;
		}
		else {
			ostr << " " << "contentencoding=" << '"' << "base64" << '"' << '>' << std::endl
				<< base64_encode(this->message_data_.data(), (unsigned int)this->message_data_.size()) << std::endl;
		}
		ostr << "</event>" << std::endl;
	}